

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

MPI_Op mxx::get_builtin_op<float,_const_float_&(*)(const_float_&,_const_float_&)>::op
                 (_func_float_ptr_float_ptr_float_ptr *t)

{
  _func_float_ptr_float_ptr_float_ptr *t_local;
  
  if (t == std::min<float>) {
    t_local = (_func_float_ptr_float_ptr_float_ptr *)&ompi_mpi_op_min;
  }
  else if (t == std::max<float>) {
    t_local = (_func_float_ptr_float_ptr_float_ptr *)&ompi_mpi_op_max;
  }
  else {
    t_local = (_func_float_ptr_float_ptr_float_ptr *)&ompi_mpi_op_null;
  }
  return (MPI_Op)t_local;
}

Assistant:

static MPI_Op op(const T& (*t)(const T&, const T&)) {
        // check if function is std::min or std::max
        if (t == static_cast<const T&(*)(const T&, const T&)>(std::min<T>)){
            return MPI_MIN;
        } else if (t == static_cast<const T&(*)(const T&, const T&)>(std::max<T>)){
            return MPI_MAX;
        } else {
            // otherwise return NULL
            return MPI_OP_NULL;
        }
    }